

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arenaViolation.c
# Opt level: O0

Vec_Ptr_t * collectCSSignalsWithDSC(Abc_Ntk_t *pNtk,Aig_Man_t *pAig)

{
  int iVar1;
  Vec_Ptr_t *p;
  Aig_Obj_t *pAVar2;
  Abc_Obj_t *pAVar3;
  char *pcVar4;
  Aig_Obj_t *pAVar5;
  Vec_Ptr_t *vNodeArray;
  Aig_Obj_t *pConsequent;
  Aig_Obj_t *pObj;
  int i;
  Aig_Man_t *pAig_local;
  Abc_Ntk_t *pNtk_local;
  
  vNodeArray = (Vec_Ptr_t *)0x0;
  p = Vec_PtrAlloc(1);
  for (pObj._4_4_ = 0; iVar1 = Saig_ManPoNum(pAig), pObj._4_4_ < iVar1; pObj._4_4_ = pObj._4_4_ + 1)
  {
    pAVar2 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vCos,pObj._4_4_);
    pAVar3 = Abc_NtkPo(pNtk,pObj._4_4_);
    pcVar4 = Abc_ObjName(pAVar3);
    pcVar4 = strstr(pcVar4,"csLiveConst_");
    if (pcVar4 == (char *)0x0) {
      pAVar3 = Abc_NtkPo(pNtk,pObj._4_4_);
      pcVar4 = Abc_ObjName(pAVar3);
      pcVar4 = strstr(pcVar4,"csLiveTarget_");
      if (pcVar4 != (char *)0x0) {
        pAVar5 = Aig_ObjFanin0(pAVar2);
        iVar1 = Aig_ObjFaninC0(pAVar2);
        vNodeArray = (Vec_Ptr_t *)Aig_NotCond(pAVar5,iVar1);
      }
    }
    else {
      pAVar5 = Aig_ObjFanin0(pAVar2);
      iVar1 = Aig_ObjFaninC0(pAVar2);
      pAVar2 = Aig_NotCond(pAVar5,iVar1);
      Vec_PtrPush(p,pAVar2);
    }
  }
  if (vNodeArray != (Vec_Ptr_t *)0x0) {
    Vec_PtrPush(p,vNodeArray);
    return p;
  }
  __assert_fail("pConsequent",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/live/arenaViolation.c"
                ,0xfa,"Vec_Ptr_t *collectCSSignalsWithDSC(Abc_Ntk_t *, Aig_Man_t *)");
}

Assistant:

Vec_Ptr_t *collectCSSignalsWithDSC( Abc_Ntk_t *pNtk, Aig_Man_t *pAig )
{
    int i;
    Aig_Obj_t *pObj, *pConsequent = NULL;
    Vec_Ptr_t *vNodeArray;

    vNodeArray = Vec_PtrAlloc(1);

    Saig_ManForEachPo( pAig, pObj, i )
    {
        if( strstr( Abc_ObjName(Abc_NtkPo( pNtk, i )), "csLiveConst_" ) != NULL )
            Vec_PtrPush( vNodeArray, Aig_NotCond((Aig_Obj_t *)Aig_ObjFanin0(pObj), Aig_ObjFaninC0(pObj)) );    
        else if( strstr( Abc_ObjName(Abc_NtkPo( pNtk, i )), "csLiveTarget_" ) != NULL )
            pConsequent = Aig_NotCond((Aig_Obj_t *)Aig_ObjFanin0(pObj), Aig_ObjFaninC0(pObj));
    }
    assert( pConsequent );
    Vec_PtrPush( vNodeArray, pConsequent );    
    return vNodeArray;
}